

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void OPN2_GenerateResampled(ym3438_t *chip,Bit16s *buf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Bit16s buffer [2];
  short local_1c;
  short local_1a;
  
  iVar2 = chip->rateratio;
  iVar1 = chip->samplecnt;
  while (iVar3 = iVar2 - iVar1, iVar3 == 0 || iVar2 < iVar1) {
    *(undefined8 *)chip->oldsamples = *(undefined8 *)chip->samples;
    OPN2_Generate(chip,&local_1c);
    chip->samples[0] = local_1c * 0xb;
    chip->samples[1] = local_1a * 0xb;
    iVar2 = chip->rateratio;
    iVar1 = chip->samplecnt - iVar2;
    chip->samplecnt = iVar1;
  }
  *buf = (Bit16s)((ulong)((long)(chip->samples[0] * iVar1 + chip->oldsamples[0] * iVar3) /
                         (long)iVar2) >> 1);
  buf[1] = (Bit16s)((ulong)((long)(chip->samples[1] * iVar1 + iVar3 * chip->oldsamples[1]) /
                           (long)iVar2) >> 1);
  chip->samplecnt = iVar1 + 0x400;
  return;
}

Assistant:

void OPN2_GenerateResampled(ym3438_t *chip, Bit16s *buf)
{
    Bit16s buffer[2];

    while (chip->samplecnt >= chip->rateratio)
    {
        chip->oldsamples[0] = chip->samples[0];
        chip->oldsamples[1] = chip->samples[1];
        OPN2_Generate(chip, buffer);
        chip->samples[0] = buffer[0] * 11;
        chip->samples[1] = buffer[1] * 11;
        chip->samplecnt -= chip->rateratio;
    }
    buf[0] = (Bit16s)(((chip->oldsamples[0] * (chip->rateratio - chip->samplecnt)
                     + chip->samples[0] * chip->samplecnt) / chip->rateratio)>>1);
    buf[1] = (Bit16s)(((chip->oldsamples[1] * (chip->rateratio - chip->samplecnt)
                     + chip->samples[1] * chip->samplecnt) / chip->rateratio)>>1);
    chip->samplecnt += 1 << RSM_FRAC;
}